

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  cmMessenger *messenger;
  reference __lhs;
  size_type sVar5;
  reference ppcVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_550;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_548;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_520;
  const_iterator local_518;
  int local_510 [4];
  undefined1 local_500 [8];
  cmListFileFunction project;
  cmListFileFunction *func_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2_1;
  undefined1 local_478 [7];
  bool hasProject;
  allocator<char> local_451;
  string local_450;
  _Self local_430;
  _Self local_428;
  reference local_420;
  cmListFileFunction *func_1;
  iterator __end4;
  iterator __begin4;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range4;
  allocator<char> local_3e9;
  value_type local_3e8;
  _Base_ptr local_3c8;
  undefined1 local_3c0;
  allocator<char> local_3b1;
  value_type local_3b0;
  _Base_ptr local_390;
  undefined1 local_388;
  allocator<char> local_379;
  value_type local_378;
  _Base_ptr local_358;
  undefined1 local_350;
  allocator<char> local_341;
  value_type local_340;
  _Base_ptr local_320;
  undefined1 local_318;
  allocator<char> local_309;
  value_type local_308;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  allocator<char> local_2d1;
  value_type local_2d0;
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  allocator<char> local_299;
  value_type local_298;
  _Base_ptr local_278;
  undefined1 local_270;
  allocator<char> local_261;
  value_type local_260;
  _Base_ptr local_240;
  undefined1 local_238;
  allocator<char> local_229;
  value_type local_228;
  _Base_ptr local_208;
  undefined1 local_200;
  allocator<char> local_1f1;
  value_type local_1f0;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  allocator<char> local_1b9;
  value_type local_1b8;
  undefined1 local_198 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  bool isProblem;
  cmListFileFunction *func;
  iterator __end2;
  iterator __begin2;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2;
  undefined1 local_138 [3];
  bool hasVersion;
  cmListFile listFile;
  string local_118;
  cmStateDirectory local_f8;
  undefined1 local_d0 [8];
  string filesDir;
  BuildsystemFileScope scope;
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  string currentStart;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = this;
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_58);
  std::__cxx11::string::string((string *)local_30,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_30,"/CMakeLists.txt");
  cmListFileBacktrace::Push((cmListFileBacktrace *)&scope.ReportError,(string *)&this->Backtrace);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&scope.ReportError);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&scope.ReportError);
  BuildsystemFileScope::BuildsystemFileScope
            ((BuildsystemFileScope *)((long)&filesDir.field_2 + 8),this);
  cmStateSnapshot::GetDirectory(&local_f8,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_f8);
  std::__cxx11::string::string((string *)local_d0,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_d0,"/CMakeFiles");
  cmsys::SystemTools::MakeDirectory((string *)local_d0,(mode_t *)0x0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_30,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                  ,0x601,"void cmMakefile::Configure()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_PARENT_LIST_FILE",
             (allocator<char> *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_118,pcVar4);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmListFile::cmListFile((cmListFile *)local_138);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_138,pcVar4,messenger,&this->Backtrace);
  if (bVar1) {
    bVar1 = IsRootMakefile(this);
    if (bVar1) {
      bVar1 = false;
      __end2 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_138);
      func = (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_138
                       );
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                         *)&func), bVar2) {
        __lhs = __gnu_cxx::
                __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                ::operator*(&__end2);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"cmake_minimum_required");
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2);
      }
      if (!bVar1) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                           local_138);
        if (sVar5 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,"project",&local_1b9);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_1b8);
          local_1d0 = (_Base_ptr)pVar7.first._M_node;
          local_1c8 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"set",&local_1f1);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_1f0);
          local_208 = (_Base_ptr)pVar7.first._M_node;
          local_200 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator(&local_1f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"if",&local_229);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_228);
          local_240 = (_Base_ptr)pVar7.first._M_node;
          local_238 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator(&local_229);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,"endif",&local_261);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_260);
          local_278 = (_Base_ptr)pVar7.first._M_node;
          local_270 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"else",&local_299)
          ;
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_298);
          local_2b0 = (_Base_ptr)pVar7.first._M_node;
          local_2a8 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator(&local_299);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"elseif",&local_2d1);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_2d0);
          local_2e8 = (_Base_ptr)pVar7.first._M_node;
          local_2e0 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_308,"add_executable",&local_309);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_308);
          local_320 = (_Base_ptr)pVar7.first._M_node;
          local_318 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_308);
          std::allocator<char>::~allocator(&local_309);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_340,"add_library",&local_341);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_340);
          local_358 = (_Base_ptr)pVar7.first._M_node;
          local_350 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_340);
          std::allocator<char>::~allocator(&local_341);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"target_link_libraries",&local_379);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_378);
          local_390 = (_Base_ptr)pVar7.first._M_node;
          local_388 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator(&local_379);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b0,"option",&local_3b1);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_198,&local_3b0);
          local_3c8 = (_Base_ptr)pVar7.first._M_node;
          local_3c0 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_3b0);
          std::allocator<char>::~allocator(&local_3b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"message",&local_3e9);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_198,&local_3e8);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          __end4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              local_138);
          func_1 = (cmListFileFunction *)
                   std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              local_138);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                             *)&func_1), bVar1) {
            local_420 = __gnu_cxx::
                        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                        ::operator*(&__end4);
            local_428._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_198,(key_type *)local_420);
            local_430._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_198);
            bVar1 = std::operator==(&local_428,&local_430);
            if (bVar1) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&__end4);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_198);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          SetCheckCMP0000(this,true);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"2.4",&local_451);
          std::__cxx11::string::string((string *)local_478);
          SetPolicyVersion(this,&local_450,(string *)local_478);
          std::__cxx11::string::~string((string *)local_478);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator(&local_451);
        }
      }
      bVar1 = false;
      __end2_1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                           ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                            local_138);
      func_2 = (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_138);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                 *)&func_2), bVar2) {
        project.Arguments.
        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                      ::operator*(&__end2_1);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )project.Arguments.
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"project");
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2_1);
      }
      if (!bVar1) {
        cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_500);
        std::__cxx11::string::operator=((string *)local_500,"project");
        local_510[3] = 0;
        local_510[2] = 0;
        std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
        emplace_back<char_const(&)[8],cmListFileArgument::Delimiter,int>
                  ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                   &project.super_cmCommandContext.Line,(char (*) [8])0x79a09b,
                   (Delimiter *)(local_510 + 3),local_510 + 2);
        local_510[1] = 0;
        local_510[0] = 0;
        std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
        emplace_back<char_const(&)[35],cmListFileArgument::Delimiter,int>
                  ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                   &project.super_cmCommandContext.Line,
                   (char (*) [35])"__CMAKE_INJECTED_PROJECT_COMMAND__",(Delimiter *)(local_510 + 1),
                   local_510);
        local_520._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_138
                       );
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_518,&local_520);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_138,
                   local_518,(value_type *)local_500);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_500);
      }
    }
    ReadListFile(this,(cmListFile *)local_138,(string *)local_30);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      BuildsystemFileScope::Quiet((BuildsystemFileScope *)((long)&filesDir.field_2 + 8));
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
               &this->UnConfiguredDirectories);
    local_548._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    while( true ) {
      local_550._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                     ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
      bVar1 = __gnu_cxx::operator!=(&local_548,&local_550);
      if (!bVar1) break;
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_548);
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar6)->StateSnapshot);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_548);
      ConfigureSubDirectory(this,*ppcVar6);
      __gnu_cxx::
      __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
      operator++(&local_548);
    }
    AddCMakeDependFilesFromUser(this);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
  }
  cmListFile::~cmListFile((cmListFile *)local_138);
  std::__cxx11::string::~string((string *)local_d0);
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)((long)&filesDir.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += "/CMakeFiles";
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (allowedCommands.find(func.Name.Lower) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4", std::string());
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      cmListFileFunction project;
      project.Name.Lower = "project";
      project.Arguments.emplace_back("Project", cmListFileArgument::Unquoted,
                                     0);
      project.Arguments.emplace_back("__CMAKE_INJECTED_PROJECT_COMMAND__",
                                     cmListFileArgument::Unquoted, 0);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}